

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_nanoftp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing nanoftp : 14 of 22 functions ...\n");
  }
  iVar1 = test_xmlNanoFTPCheckResponse();
  iVar2 = test_xmlNanoFTPCleanup();
  iVar3 = test_xmlNanoFTPCloseConnection();
  iVar4 = test_xmlNanoFTPCwd();
  iVar5 = test_xmlNanoFTPDele();
  iVar6 = test_xmlNanoFTPGet();
  iVar7 = test_xmlNanoFTPGetConnection();
  iVar8 = test_xmlNanoFTPGetResponse();
  iVar9 = test_xmlNanoFTPGetSocket();
  iVar10 = test_xmlNanoFTPInit();
  iVar11 = test_xmlNanoFTPList();
  iVar12 = test_xmlNanoFTPNewCtxt();
  iVar13 = test_xmlNanoFTPOpen();
  iVar14 = test_xmlNanoFTPProxy();
  iVar15 = test_xmlNanoFTPQuit();
  iVar16 = test_xmlNanoFTPRead();
  iVar17 = test_xmlNanoFTPScanProxy();
  iVar18 = test_xmlNanoFTPUpdateURL();
  uVar19 = iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar19 != 0) {
    printf("Module nanoftp: %d errors\n",(ulong)uVar19);
  }
  return uVar19;
}

Assistant:

static int
test_nanoftp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanoftp : 14 of 22 functions ...\n");
    test_ret += test_xmlNanoFTPCheckResponse();
    test_ret += test_xmlNanoFTPCleanup();
    test_ret += test_xmlNanoFTPCloseConnection();
    test_ret += test_xmlNanoFTPCwd();
    test_ret += test_xmlNanoFTPDele();
    test_ret += test_xmlNanoFTPGet();
    test_ret += test_xmlNanoFTPGetConnection();
    test_ret += test_xmlNanoFTPGetResponse();
    test_ret += test_xmlNanoFTPGetSocket();
    test_ret += test_xmlNanoFTPInit();
    test_ret += test_xmlNanoFTPList();
    test_ret += test_xmlNanoFTPNewCtxt();
    test_ret += test_xmlNanoFTPOpen();
    test_ret += test_xmlNanoFTPProxy();
    test_ret += test_xmlNanoFTPQuit();
    test_ret += test_xmlNanoFTPRead();
    test_ret += test_xmlNanoFTPScanProxy();
    test_ret += test_xmlNanoFTPUpdateURL();

    if (test_ret != 0)
	printf("Module nanoftp: %d errors\n", test_ret);
    return(test_ret);
}